

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall
tetgenmesh::insertconstrainedpoints(tetgenmesh *this,point *insertarray,int arylen,int rejflag)

{
  ulong uVar1;
  tetrahedron *pppdVar2;
  point pdVar3;
  double *pdVar4;
  long lVar5;
  int iVar6;
  tetgenbehavior *ptVar7;
  arraypool *paVar8;
  arraypool *paVar9;
  tetrahedron *pppdVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  triface searchtet;
  face splitseg;
  int ngroup;
  flipconstraints fc;
  int local_184;
  triface local_180;
  face local_170;
  long local_160;
  face local_158;
  long local_148;
  long local_140;
  long local_138;
  long local_130;
  ulong local_128;
  int local_11c;
  insertvertexflags local_118;
  flipconstraints local_a8;
  
  local_180.tet = (tetrahedron *)0x0;
  local_180.ver = 0;
  local_170.sh = (shellface *)0x0;
  local_170.shver = 0;
  local_158.sh = (shellface *)0x0;
  local_158.shver = 0;
  local_118.refinetet.ver = 0;
  local_118.refinesh.shver = 0;
  local_118.refinetet.tet = (tetrahedron *)0x0;
  local_118.refinesh.sh = (shellface *)0x0;
  local_118.smlenflag = 0;
  local_118.smlen = 0.0;
  local_118.iloc = 0;
  local_118.bowywat = 0;
  local_118.lawson = 0;
  local_118.splitbdflag = 0;
  local_118.validflag = 0;
  local_118.respectbdflag = 0;
  local_118.rejflag = 0;
  local_118.chkencflag = 0;
  local_118.cdtflag = 0;
  local_118.assignmeshsize = 0;
  local_118.sloc = 0;
  local_118.sbowywat = 0;
  local_118.refineflag = 0;
  local_a8.seg[0] = (point)0x0;
  local_a8.fac[0] = (point)0x0;
  local_a8.remvert = (point)0x0;
  local_a8.enqflag = 0;
  local_a8.chkencflag = 0;
  local_a8.unflip = 0;
  local_a8.collectnewtets = 0;
  local_a8.collectencsegflag = 0;
  local_a8.remove_ndelaunay_edge = 0;
  local_a8.bak_tetprism_vol._0_4_ = 0;
  local_a8.bak_tetprism_vol._4_4_ = 0;
  local_a8.tetprism_vol_sum._0_4_ = 0;
  local_a8._36_8_ = 0;
  local_a8.cosdihed_in = 0.0;
  local_a8.cosdihed_out = 0.0;
  local_a8.checkflipeligibility = 0;
  ptVar7 = this->b;
  if (ptVar7->verbose != 0) {
    printf("  Inserting %d constrained points\n",(ulong)(uint)arylen);
    ptVar7 = this->b;
  }
  if (ptVar7->no_sort == 0) {
    if (ptVar7->verbose != 0) {
      puts("  Permuting vertices.");
    }
    srand(arylen);
    if (0 < arylen) {
      uVar13 = 0;
      do {
        iVar6 = rand();
        uVar1 = uVar13 + 1;
        iVar6 = iVar6 % (int)uVar1;
        pdVar3 = insertarray[uVar13];
        insertarray[uVar13] = insertarray[iVar6];
        insertarray[iVar6] = pdVar3;
        uVar13 = uVar1;
      } while ((uint)arylen != uVar1);
    }
    if (this->b->brio_hilbert == 0) {
      local_184 = 1;
    }
    else {
      if (this->b->verbose != 0) {
        puts("  Sorting vertices.");
      }
      hilbert_init(this,this->in->mesh_dim);
      local_11c = 0;
      brio_multiscale_sort
                (this,insertarray,arylen,this->b->brio_threshold,this->b->brio_ratio,&local_11c);
      local_184 = 0;
    }
  }
  else {
    local_184 = 0;
    if (ptVar7->verbose != 0) {
      puts("  Using the input order.");
    }
  }
  lVar12 = this->nonregularcount;
  this->nonregularcount = 0;
  local_160 = this->samples;
  this->samples = 3;
  bVar14 = this->b->incrflip == 0;
  if (!bVar14) {
    local_a8.enqflag = 2;
  }
  local_140 = this->st_segref_count;
  local_138 = this->st_facref_count;
  local_130 = this->st_volref_count;
  local_118.bowywat._0_1_ = bVar14;
  local_118.bowywat._1_3_ = 0;
  local_118.chkencflag = 0;
  local_118.rejflag = rejflag;
  local_118.sloc = 0xb;
  local_118.sbowywat = 3;
  local_118.splitbdflag = 1;
  local_118.lawson = (uint)!bVar14;
  local_118.respectbdflag = 1;
  local_118.validflag = (uint)bVar14;
  local_118.assignmeshsize = this->b->metric;
  paVar8 = (arraypool *)operator_new(0x30);
  paVar8->objectbytes = 0x10;
  paVar8->objectsperblock = 0x100;
  paVar8->log2objectsperblock = 8;
  paVar8->objectsperblockmark = 0xff;
  paVar8->toparraylen = 0;
  paVar8->toparray = (char **)0x0;
  paVar8->objects = 0;
  paVar8->totalmemory = 0;
  this->encseglist = paVar8;
  paVar9 = (arraypool *)operator_new(0x30);
  paVar9->objectbytes = 0x88;
  paVar9->objectsperblock = 0x100;
  paVar9->log2objectsperblock = 8;
  paVar9->objectsperblockmark = 0xff;
  paVar9->toparraylen = 0;
  paVar9->toparray = (char **)0x0;
  paVar9->objects = 0;
  paVar9->totalmemory = 0;
  this->encshlist = paVar9;
  if (0 < arylen) {
    local_128 = (ulong)(uint)arylen;
    uVar13 = 0;
    local_148 = lVar12;
    do {
      local_180.tet = (tetrahedron *)0x0;
      iVar6 = scoutpoint(this,insertarray[uVar13],&local_180,local_184);
      local_118.iloc = iVar6;
      pdVar3 = insertarray[uVar13];
      *(uint *)((long)pdVar3 + (long)this->pointmarkindex * 4 + 4) =
           *(byte *)((long)pdVar3 + (long)this->pointmarkindex * 4 + 4) | 0x800;
      local_170.sh = (shellface *)0x0;
      local_158.sh = (shellface *)0x0;
      if (iVar6 == 3) {
        if (local_180.tet[9] != (tetrahedron)0x0) {
          pdVar4 = local_180.tet[9][local_180.ver & 3];
          if (pdVar4 != (double *)0x0) {
            local_170.shver = tspivottbl[local_180.ver][(uint)pdVar4 & 7];
LAB_00141cf5:
            local_170.sh = (shellface *)((ulong)pdVar4 & 0xfffffffffffffff8);
            uVar11 = 0x700;
            goto LAB_00141cfa;
          }
        }
      }
      else if (iVar6 == 4) {
        pppdVar10 = local_180.tet;
        uVar11 = local_180.ver;
        if ((local_180.tet[8] == (tetrahedron)0x0) ||
           (pdVar4 = local_180.tet[8][ver2edge[local_180.ver]], pdVar4 == (double *)0x0)) {
          do {
            if ((pppdVar10[9] != (tetrahedron)0x0) &&
               (pdVar4 = pppdVar10[9][uVar11 & 3], pdVar4 != (double *)0x0)) {
              local_170.shver = tspivottbl[(int)uVar11][(uint)pdVar4 & 7];
              goto LAB_00141cf5;
            }
            pppdVar2 = pppdVar10 + facepivot1[(int)uVar11];
            pppdVar10 = (tetrahedron *)((ulong)*pppdVar2 & 0xfffffffffffffff0);
            uVar11 = facepivot2[(int)uVar11][(uint)*pppdVar2 & 0xf];
          } while (local_180.tet != pppdVar10);
        }
        else {
          local_158.shver = (uint)pdVar4 & 7;
          local_158.sh = (shellface *)((ulong)pdVar4 & 0xfffffffffffffff8);
          uVar11 = 0x600;
LAB_00141cfa:
          *(uint *)((long)pdVar3 + (long)this->pointmarkindex * 4 + 4) =
               *(byte *)((long)pdVar3 + (long)this->pointmarkindex * 4 + 4) | uVar11;
        }
      }
      iVar6 = insertpoint(this,pdVar3,&local_180,&local_170,&local_158,&local_118);
      if (iVar6 == 0) {
        *(uint *)((long)insertarray[uVar13] + (long)this->pointmarkindex * 4 + 4) =
             (uint)*(byte *)((long)insertarray[uVar13] + (long)this->pointmarkindex * 4 + 4);
        this->unuverts = this->unuverts + 1;
        this->encseglist->objects = 0;
        this->encshlist->objects = 0;
      }
      else {
        if (this->flipstack != (badface *)0x0) {
          lawsonflip3d(this,&local_a8);
          this->unflipqueue->objects = 0;
        }
        iVar6 = *(int *)((long)insertarray[uVar13] + (long)this->pointmarkindex * 4 + 4) >> 8;
        if (iVar6 == 7) {
          this->st_facref_count = this->st_facref_count + 1;
        }
        else if (iVar6 == 6) {
          this->st_segref_count = this->st_segref_count + 1;
        }
        else {
          this->st_volref_count = this->st_volref_count + 1;
        }
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != local_128);
    paVar8 = this->encseglist;
    lVar12 = local_148;
    if (paVar8 == (arraypool *)0x0) {
      paVar8 = (arraypool *)0x0;
      goto LAB_00141de3;
    }
  }
  arraypool::~arraypool(paVar8);
LAB_00141de3:
  lVar5 = local_160;
  operator_delete(paVar8,0x30);
  paVar8 = this->encshlist;
  if (paVar8 != (arraypool *)0x0) {
    arraypool::~arraypool(paVar8);
  }
  operator_delete(paVar8,0x30);
  if ((this->b->verbose != 0) &&
     (printf("  Inserted %ld (%ld, %ld, %ld) vertices.\n",
             (this->st_segref_count - (local_138 + local_140 + local_130)) + this->st_facref_count +
             this->st_volref_count,this->st_segref_count - local_140,
             this->st_facref_count - local_138,this->st_volref_count - local_130),
     0 < this->nonregularcount)) {
    printf("  Performed %ld brute-force searches.\n");
  }
  this->nonregularcount = lVar12;
  this->samples = lVar5;
  return;
}

Assistant:

void tetgenmesh::insertconstrainedpoints(point *insertarray, int arylen,
                                         int rejflag)
{
  triface searchtet, spintet;
  face splitsh;
  face splitseg;
  insertvertexflags ivf;
  flipconstraints fc;
  int randflag = 0;
  int t1ver;
  int i;

  if (b->verbose) {
    printf("  Inserting %d constrained points\n", arylen);
  }

  if (b->no_sort) { // -b/1 option.
    if (b->verbose) {
      printf("  Using the input order.\n"); 
    }
  } else {
    if (b->verbose) {
      printf("  Permuting vertices.\n"); 
    }
    point swappoint;
    int randindex;
    srand(arylen);
    for (i = 0; i < arylen; i++) {
      randindex = rand() % (i + 1); 
      swappoint = insertarray[i];
      insertarray[i] = insertarray[randindex];
      insertarray[randindex] = swappoint;
    }
    if (b->brio_hilbert) { // -b1 option
      if (b->verbose) {
        printf("  Sorting vertices.\n"); 
      }
      hilbert_init(in->mesh_dim);
      int ngroup = 0; 
      brio_multiscale_sort(insertarray, arylen, b->brio_threshold, 
                           b->brio_ratio, &ngroup);
    } else { // -b0 option.
      randflag = 1;
    } // if (!b->brio_hilbert)
  } // if (!b->no_sort)

  long bak_nonregularcount = nonregularcount;
  nonregularcount = 0l;
  long baksmaples = samples;
  samples = 3l; // Use at least 3 samples. Updated in randomsample().

  long bak_seg_count = st_segref_count;
  long bak_fac_count = st_facref_count;
  long bak_vol_count = st_volref_count;

  // Initialize the insertion parameters. 
  if (b->incrflip) { // -l option
    // Use incremental flip algorithm.
    ivf.bowywat = 0; 
    ivf.lawson = 1;
    ivf.validflag = 0; // No need to validate the cavity.
    fc.enqflag = 2;
  } else {
    // Use Bowyer-Watson algorithm.
    ivf.bowywat = 1; 
    ivf.lawson = 0;
    ivf.validflag = 1; // Validate the B-W cavity.
  }
  ivf.rejflag = rejflag;
  ivf.chkencflag = 0; 
  ivf.sloc = (int) INSTAR;
  ivf.sbowywat = 3; 
  ivf.splitbdflag = 1;
  ivf.respectbdflag = 1;
  ivf.assignmeshsize = b->metric;

  encseglist = new arraypool(sizeof(face), 8);
  encshlist = new arraypool(sizeof(badface), 8);

  // Insert the points.
  for (i = 0; i < arylen; i++) {
    // Find the location of the inserted point.
    // Do not use 'recenttet', since the mesh may be non-convex.
    searchtet.tet = NULL; 
    ivf.iloc = scoutpoint(insertarray[i], &searchtet, randflag);

    // Decide the right type for this point.
    setpointtype(insertarray[i], FREEVOLVERTEX); // Default.
    splitsh.sh = NULL;
    splitseg.sh = NULL;
    if (ivf.iloc == (int) ONEDGE) {
      if (issubseg(searchtet)) {
        tsspivot1(searchtet, splitseg);
        setpointtype(insertarray[i], FREESEGVERTEX);
        //ivf.rejflag = 0;
      } else {
        // Check if it is a subface edge.
        spintet = searchtet;
        while (1) {
          if (issubface(spintet)) {
            tspivot(spintet, splitsh);
            setpointtype(insertarray[i], FREEFACETVERTEX);
            //ivf.rejflag |= 1;
            break;
          }
          fnextself(spintet);
          if (spintet.tet == searchtet.tet) break;
        }
      }
    } else if (ivf.iloc == (int) ONFACE) {
      if (issubface(searchtet)) {
        tspivot(searchtet, splitsh);
        setpointtype(insertarray[i], FREEFACETVERTEX);
        //ivf.rejflag |= 1;
      }
    }

    // Now insert the point.
    if (insertpoint(insertarray[i], &searchtet, &splitsh, &splitseg, &ivf)) {
      if (flipstack != NULL) {
        // There are queued faces. Use flips to recover Delaunayness.
        lawsonflip3d(&fc);
        // There may be unflippable edges. Ignore them.
        unflipqueue->restart();
      }
      // Update the Steiner counters.
      if (pointtype(insertarray[i]) == FREESEGVERTEX) {
        st_segref_count++;
      } else if (pointtype(insertarray[i]) == FREEFACETVERTEX) {
        st_facref_count++;
      } else {
        st_volref_count++;
      }
    } else {
      // Point is not inserted.
      //pointdealloc(insertarray[i]);
      setpointtype(insertarray[i], UNUSEDVERTEX);
      unuverts++;
      encseglist->restart();
      encshlist->restart();
    }
  } // i

  delete encseglist;
  delete encshlist;

  if (b->verbose) {
    printf("  Inserted %ld (%ld, %ld, %ld) vertices.\n", 
           st_segref_count + st_facref_count + st_volref_count - 
           (bak_seg_count + bak_fac_count + bak_vol_count),
           st_segref_count - bak_seg_count, st_facref_count - bak_fac_count,
           st_volref_count - bak_vol_count);
    if (nonregularcount > 0l) {
      printf("  Performed %ld brute-force searches.\n", nonregularcount);
    }
  }

  nonregularcount = bak_nonregularcount;
  samples = baksmaples; 
}